

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseInitializer(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ParseState copy;
  
  iVar8 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar8 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar8) {
    bVar6 = false;
    goto LAB_00267028;
  }
  uVar3 = (state->parse_state).mangled_idx;
  uVar4 = (state->parse_state).out_cur_idx;
  uVar5 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar7 = ParseTwoCharToken(state,"pi");
  if (bVar7) {
    do {
      bVar7 = ParseExpression(state);
    } while (bVar7);
    bVar7 = ParseOneCharToken(state,'E');
    bVar6 = true;
    if (!bVar7) goto LAB_00266fd9;
  }
  else {
LAB_00266fd9:
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar7 = ParseTwoCharToken(state,"il");
    if (bVar7) {
      do {
        bVar7 = ParseBracedExpression(state);
      } while (bVar7);
      bVar7 = ParseOneCharToken(state,'E');
      bVar6 = true;
      if (bVar7) goto LAB_00267023;
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = false;
  }
LAB_00267023:
  iVar8 = state->recursion_depth + -1;
LAB_00267028:
  state->recursion_depth = iVar8;
  return bVar6;
}

Assistant:

static bool ParseInitializer(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  if (ParseTwoCharToken(state, "pi") && ZeroOrMore(ParseExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "il") &&
      ZeroOrMore(ParseBracedExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;
  return false;
}